

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshTListBlock(Parser *this,uint iNumVertices,Mesh *mesh,uint iChannel)

{
  byte bVar1;
  pointer paVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint iIndex;
  int local_4c;
  undefined8 local_48;
  float local_40;
  uint local_3c;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_38;
  
  local_38 = mesh->amTexCoords + iChannel;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (local_38,(ulong)iNumVertices);
  pbVar6 = (byte *)this->filePtr;
  local_4c = 0;
  do {
    bVar1 = *pbVar6;
    if (bVar1 == 0x2a) {
      while( true ) {
        pbVar5 = pbVar6 + 1;
        this->filePtr = (char *)pbVar5;
        iVar4 = strncmp("MESH_TVERT",(char *)pbVar5,10);
        if (iVar4 != 0) break;
        bVar1 = pbVar6[0xb];
        if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
        pbVar5 = pbVar6 + 0xc;
        if (bVar1 == 0) {
          pbVar5 = pbVar6 + 0xb;
        }
        this->filePtr = (char *)pbVar5;
        local_48 = 0;
        local_40 = 0.0;
        ParseLV4MeshFloatTriple(this,(ai_real *)&local_48,&local_3c);
        if (local_3c < iNumVertices) {
          paVar2 = (local_38->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          paVar2[local_3c].z = local_40;
          paVar2 = paVar2 + local_3c;
          paVar2->x = (float)(undefined4)local_48;
          paVar2->y = (float)local_48._4_4_;
        }
        else {
          LogWarning(this,"Tvertex has an invalid index. It will be ignored");
        }
        if ((local_40 != 0.0) || (NAN(local_40))) {
          mesh->mNumUVComponents[iChannel] = 3;
        }
        pbVar6 = (byte *)this->filePtr;
        pbVar5 = pbVar6;
        if (*pbVar6 != 0x2a) break;
      }
      pbVar6 = pbVar5;
      bVar1 = *pbVar6;
    }
    bVar3 = false;
    if (bVar1 < 0x7b) {
      if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_00403ce1;
        this->iLineNumber = this->iLineNumber + 1;
        bVar3 = true;
      }
      else if (bVar1 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_TVERT_LIST chunk (Level 3)")
        ;
      }
    }
    else {
      if (bVar1 == 0x7d) {
        local_4c = local_4c + -1;
        if (local_4c == 0) {
          this->filePtr = (char *)(pbVar6 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar1 != 0x7b) goto LAB_00403ce3;
        local_4c = local_4c + 1;
      }
LAB_00403ce1:
      bVar3 = false;
    }
LAB_00403ce3:
    this->bLastWasEndLine = bVar3;
    pbVar6 = pbVar6 + 1;
    this->filePtr = (char *)pbVar6;
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshTListBlock(unsigned int iNumVertices,
    ASE::Mesh& mesh, unsigned int iChannel)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the array
    mesh.amTexCoords[iChannel].resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Vertex entry
            if (TokenMatch(filePtr,"MESH_TVERT" ,10))
            {
                aiVector3D vTemp;
                unsigned int iIndex;
                ParseLV4MeshFloatTriple(&vTemp.x,iIndex);

                if (iIndex >= iNumVertices)
                {
                    LogWarning("Tvertex has an invalid index. It will be ignored");
                }
                else mesh.amTexCoords[iChannel][iIndex] = vTemp;

                if (0.0f != vTemp.z)
                {
                    // we need 3 coordinate channels
                    mesh.mNumUVComponents[iChannel] = 3;
                }
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_TVERT_LIST");
    }
    return;
}